

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O1

Status * __thiscall
draco::PointCloudEncoder::EncodeMetadata(Status *__return_storage_ptr__,PointCloudEncoder *this)

{
  GeometryMetadata *metadata;
  bool bVar1;
  MetadataEncoder metadata_encoder;
  MetadataEncoder local_39;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  metadata = (this->point_cloud_->metadata_)._M_t.
             super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
             .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if ((metadata != (GeometryMetadata *)0x0) &&
     (bVar1 = MetadataEncoder::EncodeGeometryMetadata(&local_39,this->buffer_,metadata), !bVar1)) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Failed to encode metadata.","");
    __return_storage_ptr__->code_ = DRACO_ERROR;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_38,local_30 + (long)local_38);
    if (local_38 == local_28) {
      return __return_storage_ptr__;
    }
    operator_delete(local_38,local_28[0] + 1);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->code_ = OK;
  (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_msg_).field_2;
  (__return_storage_ptr__->error_msg_)._M_string_length = 0;
  (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Status PointCloudEncoder::EncodeMetadata() {
  if (!point_cloud_->GetMetadata()) {
    return OkStatus();
  }
  MetadataEncoder metadata_encoder;
  if (!metadata_encoder.EncodeGeometryMetadata(buffer_,
                                               point_cloud_->GetMetadata())) {
    return Status(Status::DRACO_ERROR, "Failed to encode metadata.");
  }
  return OkStatus();
}